

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::Sphere::getPrimBounds(Sphere *this,size_t param_2,affine3f *xfm)

{
  long in_RSI;
  affine3f *in_RDI;
  vec3f vVar1;
  box3f *bounds;
  affine3f _xfm;
  box3f ob;
  vec3f *this_00;
  affine3f *in_stack_fffffffffffffdc0;
  affine3f *m;
  vec3f *in_stack_fffffffffffffdd8;
  vec3f *this_01;
  box3f *in_stack_fffffffffffffde0;
  box3f *this_02;
  affine3f *in_stack_fffffffffffffe10;
  float local_1e8;
  vec3f local_1e0;
  undefined8 local_1d4;
  float local_1cc;
  vec3f local_1c8;
  vec3f local_1b4;
  undefined8 local_1a8;
  float local_1a0;
  vec3f local_198;
  box3f local_184;
  vec3f local_168;
  vec3f local_154;
  undefined8 local_148;
  float local_140;
  vec3f local_138;
  vec3f local_124;
  undefined8 local_118;
  float local_110;
  vec3f local_108;
  vec3f local_f4;
  undefined8 local_e8;
  float local_e0;
  vec3f local_d8;
  affine3f local_c4;
  vec3f local_94;
  float local_88;
  float fStack_84;
  float local_80;
  vec3f local_48;
  vec3f local_3c;
  box3f local_30 [2];
  
  math::vec3f::vec3f(&local_3c,-*(float *)(in_RSI + 0xa0));
  math::vec3f::vec3f(&local_48,*(float *)(in_RSI + 0xa0));
  math::box3f::box3f(local_30,&local_3c,&local_48);
  math::operator*(in_stack_fffffffffffffe10,in_RDI);
  math::box3f::empty_box();
  this_00 = &local_94;
  math::vec3f::vec3f(this_00,local_30[0].lower.x,local_30[0].lower.y,local_30[0].lower.z);
  vVar1 = math::xfmPoint(in_stack_fffffffffffffdc0,this_00);
  local_c4.p.x = vVar1.z;
  local_80 = local_c4.p.x;
  local_c4.l.vz._4_8_ = vVar1._0_8_;
  local_88 = local_c4.l.vz.y;
  fStack_84 = local_c4.l.vz.z;
  local_c4._28_12_ = vVar1;
  math::box3f::extend(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  m = &local_c4;
  math::vec3f::vec3f((vec3f *)m,local_30[0].lower.x,local_30[0].lower.y,local_30[0].upper.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_d8.z = vVar1.z;
  local_c4.l.vy.z = local_d8.z;
  local_d8._0_8_ = vVar1._0_8_;
  local_c4.l.vy.x = local_d8.x;
  local_c4.l.vy.y = local_d8.y;
  local_d8 = vVar1;
  math::box3f::extend(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  math::vec3f::vec3f(&local_f4,local_30[0].lower.x,local_30[0].upper.y,local_30[0].lower.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_108.z = vVar1.z;
  local_e0 = local_108.z;
  local_108._0_8_ = vVar1._0_8_;
  local_e8._0_4_ = local_108.x;
  local_e8._4_4_ = local_108.y;
  local_108 = vVar1;
  math::box3f::extend(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  math::vec3f::vec3f(&local_124,local_30[0].lower.x,local_30[0].upper.y,local_30[0].upper.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_138.z = vVar1.z;
  local_110 = local_138.z;
  local_138._0_8_ = vVar1._0_8_;
  local_118._0_4_ = local_138.x;
  local_118._4_4_ = local_138.y;
  local_138 = vVar1;
  math::box3f::extend(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  this_01 = &local_154;
  math::vec3f::vec3f(this_01,local_30[0].upper.x,local_30[0].lower.y,local_30[0].lower.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_168.z = vVar1.z;
  local_140 = local_168.z;
  local_168._0_8_ = vVar1._0_8_;
  local_148._0_4_ = local_168.x;
  local_148._4_4_ = local_168.y;
  local_168 = vVar1;
  math::box3f::extend(in_stack_fffffffffffffde0,this_01);
  this_02 = &local_184;
  math::vec3f::vec3f(&this_02->lower,local_30[0].upper.x,local_30[0].lower.y,local_30[0].upper.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_198.z = vVar1.z;
  local_184.upper.z = local_198.z;
  local_198._0_8_ = vVar1._0_8_;
  local_184.upper.x = local_198.x;
  local_184.upper.y = local_198.y;
  local_198 = vVar1;
  math::box3f::extend(this_02,this_01);
  math::vec3f::vec3f(&local_1b4,local_30[0].upper.x,local_30[0].upper.y,local_30[0].lower.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_1c8.z = vVar1.z;
  local_1a0 = local_1c8.z;
  local_1c8._0_8_ = vVar1._0_8_;
  local_1a8._0_4_ = local_1c8.x;
  local_1a8._4_4_ = local_1c8.y;
  local_1c8 = vVar1;
  math::box3f::extend(this_02,this_01);
  math::vec3f::vec3f(&local_1e0,local_30[0].upper.x,local_30[0].upper.y,local_30[0].upper.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_1d4 = vVar1._0_8_;
  local_1e8 = vVar1.z;
  local_1cc = local_1e8;
  math::box3f::extend(this_02,this_01);
  return (box3f *)in_RDI;
}

Assistant:

box3f Sphere::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f ob(vec3f(-radius),vec3f(+radius));
    affine3f _xfm = xfm * transform;
      
    box3f bounds = box3f::empty_box();
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    return bounds;
  }